

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

void alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
     build_node_implicit(V *values,int num_keys,int data_capacity,StatAccumulator *acc,
                        LinearModel<int> *model)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 in_XMM2_Qb;
  
  uVar4 = data_capacity - 1;
  uVar7 = 0xffffffffffffffff;
  uVar5 = 0;
  iVar8 = num_keys;
  while( true ) {
    if ((uint)(~(num_keys >> 0x1f) & num_keys) == uVar5) {
      return;
    }
    auVar9._8_8_ = 0;
    auVar9._0_8_ = model->a_;
    auVar11._0_8_ = (double)values[uVar5].first;
    auVar11._8_8_ = in_XMM2_Qb;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = model->b_;
    auVar1 = vfmadd213sd_fma(auVar11,auVar9,auVar1);
    uVar3 = uVar4;
    if ((int)auVar1._0_8_ <= (int)uVar4) {
      uVar3 = (int)auVar1._0_8_;
    }
    uVar6 = (int)uVar7 + 1;
    uVar3 = ~((int)uVar3 >> 0x1f) & uVar3;
    if ((int)uVar6 < (int)uVar3) {
      uVar6 = uVar3;
    }
    uVar7 = (ulong)uVar6;
    if ((int)(data_capacity - uVar6) < iVar8) break;
    (*acc->_vptr_StatAccumulator[2])(acc,uVar7);
    iVar8 = iVar8 + -1;
    uVar5 = uVar5 + 1;
  }
  uVar7 = uVar5 & 0xffffffff;
  if ((int)uVar5 < num_keys) {
    uVar7 = (ulong)(uint)num_keys;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = model->a_;
    auVar12._0_8_ = (double)values[uVar5].first;
    auVar12._8_8_ = in_XMM2_Qb;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = model->b_;
    auVar1 = vfmadd213sd_fma(auVar12,auVar10,auVar2);
    uVar3 = uVar4;
    if ((int)auVar1._0_8_ <= (int)uVar4) {
      uVar3 = (int)auVar1._0_8_;
    }
    (*acc->_vptr_StatAccumulator[2])
              (acc,(uint)(data_capacity - num_keys) + uVar5,(ulong)(~((int)uVar3 >> 0x1f) & uVar3));
  }
  return;
}

Assistant:

static void build_node_implicit(const V* values, int num_keys,
                                  int data_capacity, StatAccumulator* acc,
                                  const LinearModel<T>* model) {
    int last_position = -1;
    int keys_remaining = num_keys;
    for (int i = 0; i < num_keys; i++) {
      int predicted_position = std::max(
          0, std::min(data_capacity - 1, model->predict(values[i].first)));
      int actual_position =
          std::max<int>(predicted_position, last_position + 1);
      int positions_remaining = data_capacity - actual_position;
      if (positions_remaining < keys_remaining) {
        actual_position = data_capacity - keys_remaining;
        for (int j = i; j < num_keys; j++) {
          predicted_position = std::max(
              0, std::min(data_capacity - 1, model->predict(values[j].first)));
          acc->accumulate(actual_position, predicted_position);
          actual_position++;
        }
        break;
      }
      acc->accumulate(actual_position, predicted_position);
      last_position = actual_position;
      keys_remaining--;
    }
  }